

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# required_fields.c
# Opt level: O2

_Bool upb_util_HasUnsetRequired
                (upb_Message *msg,upb_MessageDef *m,upb_DefPool *ext_pool,
                upb_FieldPathEntry **fields)

{
  upb_FindContext local_128;
  
  local_128.has_unset_required = false;
  local_128.stack.path = (upb_FieldPathEntry *)0x0;
  local_128.stack.size = 0;
  local_128.stack.cap = 0;
  local_128.out_fields.path = (upb_FieldPathEntry *)0x0;
  local_128.out_fields.size = 0;
  local_128.out_fields.cap = 0;
  local_128.ext_pool = ext_pool;
  local_128.save_paths = fields != (upb_FieldPathEntry **)0x0;
  upb_util_FindUnsetRequiredInternal(&local_128,msg,m);
  (*upb_alloc_global.func)(&upb_alloc_global,local_128.stack.path,0,0);
  if ((fields != (upb_FieldPathEntry **)0x0 & local_128.has_unset_required) == 1) {
    upb_FieldPathVector_Reserve(&local_128,&local_128.out_fields,1);
    local_128.out_fields.path[local_128.out_fields.size].field = (upb_FieldDef *)0x0;
    *fields = local_128.out_fields.path;
  }
  return (_Bool)(local_128.has_unset_required & 1);
}

Assistant:

bool upb_util_HasUnsetRequired(const upb_Message* msg, const upb_MessageDef* m,
                               const upb_DefPool* ext_pool,
                               upb_FieldPathEntry** fields) {
  upb_FindContext ctx;
  ctx.has_unset_required = false;
  ctx.save_paths = fields != NULL;
  ctx.ext_pool = ext_pool;
  upb_FieldPathVector_Init(&ctx.stack);
  upb_FieldPathVector_Init(&ctx.out_fields);
  upb_util_FindUnsetRequiredInternal(&ctx, msg, m);
  upb_gfree(ctx.stack.path);

  if (ctx.has_unset_required && fields) {
    upb_FieldPathVector_Reserve(&ctx, &ctx.out_fields, 1);
    ctx.out_fields.path[ctx.out_fields.size] =
        (upb_FieldPathEntry){.field = NULL};
    *fields = ctx.out_fields.path;
  }

  return ctx.has_unset_required;
}